

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O0

void __thiscall OB::Term::ostream::streambuf::~streambuf(streambuf *this)

{
  streambuf *this_local;
  
  ~streambuf(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

~streambuf()
    {
      flush();
    }